

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_Error FT_Stream_ExtractFrame(FT_Stream stream,FT_ULong count,FT_Byte **pbytes)

{
  FT_Error FVar1;
  FT_Error error;
  FT_Byte **pbytes_local;
  FT_ULong count_local;
  FT_Stream stream_local;
  
  FVar1 = FT_Stream_EnterFrame(stream,count);
  if (FVar1 == 0) {
    *pbytes = stream->cursor;
    stream->cursor = (uchar *)0x0;
    stream->limit = (uchar *)0x0;
  }
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ExtractFrame( FT_Stream  stream,
                          FT_ULong   count,
                          FT_Byte**  pbytes )
  {
    FT_Error  error;


    error = FT_Stream_EnterFrame( stream, count );
    if ( !error )
    {
      *pbytes = (FT_Byte*)stream->cursor;

      /* equivalent to FT_Stream_ExitFrame(), with no memory block release */
      stream->cursor = NULL;
      stream->limit  = NULL;
    }

    return error;
  }